

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xzlib.c
# Opt level: O0

xzFile xz_open(char *path,int fd,char *mode)

{
  xmlMallocFunc p_Var1;
  size_t sVar2;
  char *pcVar3;
  uint64_t uVar4;
  int local_3c;
  xz_statep state;
  char *mode_local;
  int fd_local;
  char *path_local;
  
  path_local = (char *)(*xmlMalloc)(0x1b0);
  if ((xz_statep)path_local == (xz_statep)0x0) {
    path_local = (char *)0x0;
  }
  else {
    ((xz_statep)path_local)->size = 0;
    ((xz_statep)path_local)->want = 0x2000;
    ((xz_statep)path_local)->msg = (char *)0x0;
    ((xz_statep)path_local)->init = 0;
    p_Var1 = xmlMalloc;
    sVar2 = strlen(path);
    pcVar3 = (char *)(*p_Var1)(sVar2 + 1);
    ((xz_statep)path_local)->path = pcVar3;
    if (((xz_statep)path_local)->path == (char *)0x0) {
      (*xmlFree)(path_local);
      path_local = (char *)0x0;
    }
    else {
      strcpy(((xz_statep)path_local)->path,path);
      local_3c = fd;
      if (fd == -1) {
        local_3c = open64(path,0,0x1b6);
      }
      ((xz_statep)path_local)->fd = local_3c;
      if (((xz_statep)path_local)->fd == -1) {
        (*xmlFree)(((xz_statep)path_local)->path);
        (*xmlFree)(path_local);
        path_local = (char *)0x0;
      }
      else {
        uVar4 = lseek64(((xz_statep)path_local)->fd,0,1);
        ((xz_statep)path_local)->start = uVar4;
        if (((xz_statep)path_local)->start == 0xffffffffffffffff) {
          ((xz_statep)path_local)->start = 0;
        }
        xz_reset((xz_statep)path_local);
      }
    }
  }
  return path_local;
}

Assistant:

static xzFile
xz_open(const char *path, int fd, const char *mode ATTRIBUTE_UNUSED)
{
    xz_statep state;

    /* allocate xzFile structure to return */
    state = xmlMalloc(sizeof(xz_state));
    if (state == NULL)
        return NULL;
    state->size = 0;            /* no buffers allocated yet */
    state->want = BUFSIZ;       /* requested buffer size */
    state->msg = NULL;          /* no error message yet */
    state->init = 0;            /* initialization of zlib data */

    /* save the path name for error messages */
    state->path = xmlMalloc(strlen(path) + 1);
    if (state->path == NULL) {
        xmlFree(state);
        return NULL;
    }
    strcpy(state->path, path);

    /* open the file with the appropriate mode (or just use fd) */
    state->fd = fd != -1 ? fd : open(path,
#ifdef O_LARGEFILE
                                     O_LARGEFILE |
#endif
#ifdef O_BINARY
                                     O_BINARY |
#endif
                                     O_RDONLY, 0666);
    if (state->fd == -1) {
        xmlFree(state->path);
        xmlFree(state);
        return NULL;
    }

    /* save the current position for rewinding (only if reading) */
    state->start = lseek(state->fd, 0, SEEK_CUR);
    if (state->start == (uint64_t) - 1)
        state->start = 0;

    /* initialize stream */
    xz_reset(state);

    /* return stream */
    return (xzFile) state;
}